

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_transaction_context.cpp
# Opt level: O0

void __thiscall
TransactionContext_Input_Output_Test::TestBody(TransactionContext_Input_Output_Test *this)

{
  bool bVar1;
  uint32_t uVar2;
  reference pvVar3;
  char *pcVar4;
  char *pcVar5;
  AbstractTxInReference *pAVar6;
  AbstractTxOutReference *pAVar7;
  undefined1 uVar8;
  Amount AVar9;
  CfdException *anon_var_0;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  UtxoData utxo_stub;
  AssertionResult gtest_ar_18;
  AssertionResult gtest_ar_17;
  AssertionResult gtest_ar_16;
  AssertionResult gtest_ar_15;
  vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_> ref_list_1;
  AssertionResult gtest_ar_14;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_> ref_list;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  Address address2;
  Address address1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indexes;
  TransactionContext ctx;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxos;
  UtxoData utxo4;
  UtxoData utxo3;
  UtxoData utxo2;
  UtxoData utxo1;
  uint32_t in_stack_ffffffffffffd928;
  undefined2 in_stack_ffffffffffffd92c;
  undefined1 in_stack_ffffffffffffd92e;
  undefined1 in_stack_ffffffffffffd92f;
  UtxoData *in_stack_ffffffffffffd930;
  undefined7 in_stack_ffffffffffffd938;
  undefined1 in_stack_ffffffffffffd93f;
  TransactionContext *in_stack_ffffffffffffd940;
  undefined7 in_stack_ffffffffffffd948;
  undefined1 in_stack_ffffffffffffd94f;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffd950;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *in_stack_ffffffffffffd958;
  undefined7 in_stack_ffffffffffffd960;
  undefined1 in_stack_ffffffffffffd967;
  undefined8 in_stack_ffffffffffffd978;
  TransactionContext *in_stack_ffffffffffffd980;
  UtxoData *in_stack_ffffffffffffd990;
  undefined7 in_stack_ffffffffffffd9a0;
  undefined1 in_stack_ffffffffffffd9a7;
  Address *in_stack_ffffffffffffd9a8;
  TransactionContext *in_stack_ffffffffffffd9b0;
  AssertHelper local_24e0;
  Message local_24d8 [2];
  byte local_24c1;
  ConstCharPtr local_24c0 [132];
  uint32_t in_stack_ffffffffffffdf64;
  UtxoData *in_stack_ffffffffffffdf68;
  TransactionContext *in_stack_ffffffffffffdf70;
  AssertHelper local_1fc8;
  Message local_1fc0;
  undefined8 local_1fb8;
  int64_t local_1fb0;
  undefined1 local_1fa8;
  Amount local_1fa0;
  TransactionContext *local_1f90;
  AssertionResult local_1f88;
  AssertHelper local_1f78;
  Message local_1f70;
  undefined8 local_1f68;
  int64_t local_1f60;
  undefined1 local_1f58;
  Amount local_1f50;
  double local_1f40;
  AssertionResult local_1f38;
  AssertHelper local_1f28;
  Message local_1f20;
  Script local_1f18;
  string local_1ee0;
  Script local_1ec0;
  string local_1e88;
  AssertionResult local_1e68;
  AssertHelper local_1e58;
  Message local_1e50;
  Script local_1e48;
  string local_1e10;
  Script local_1df0;
  string local_1db8;
  AssertionResult local_1d98;
  vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_> local_1d88;
  AssertHelper local_1d70;
  Message local_1d68;
  undefined4 local_1d5c;
  AssertionResult local_1d58;
  AssertHelper local_1d48;
  Message local_1d40;
  undefined4 local_1d34;
  AssertionResult local_1d30;
  AssertHelper local_1d20;
  Message local_1d18;
  undefined4 local_1d10;
  uint32_t local_1d0c;
  AssertionResult local_1d08;
  AssertHelper local_1cf8;
  Message local_1cf0;
  undefined4 local_1ce8;
  uint32_t local_1ce4;
  AssertionResult local_1ce0;
  AssertHelper local_1cd0;
  Message local_1cc8;
  undefined4 local_1cc0;
  uint32_t local_1cbc;
  AssertionResult local_1cb8;
  AssertHelper local_1ca8;
  Message local_1ca0;
  undefined4 local_1c98;
  uint32_t local_1c94;
  AssertionResult local_1c90;
  AssertHelper local_1c80;
  Message local_1c78;
  undefined4 local_1c70;
  uint32_t local_1c6c;
  AssertionResult local_1c68;
  AssertHelper local_1c58;
  Message local_1c50;
  string local_1c48;
  Txid local_1c28;
  string local_1c08;
  AssertionResult local_1be8;
  AssertHelper local_1bd8;
  Message local_1bd0;
  string local_1bc8;
  Txid local_1ba8;
  string local_1b88;
  AssertionResult local_1b68;
  AssertHelper local_1b58;
  Message local_1b50;
  string local_1b48;
  Txid local_1b28;
  string local_1b08;
  AssertionResult local_1ae8;
  AssertHelper local_1ad8;
  Message local_1ad0;
  string local_1ac8;
  Txid local_1aa8;
  string local_1a88;
  AssertionResult local_1a68;
  vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_> local_1a58;
  AssertHelper local_1a40;
  Message local_1a38;
  undefined4 local_1a30;
  uint32_t local_1a2c;
  AssertionResult local_1a28;
  AssertHelper local_1a18;
  Message local_1a10;
  undefined4 local_1a08;
  uint32_t local_1a04;
  AssertionResult local_1a00;
  AssertHelper local_19f0;
  Message local_19e8;
  undefined4 local_19e0;
  uint32_t local_19dc;
  AssertionResult local_19d8;
  AssertHelper local_19c8;
  Message local_19c0;
  undefined4 local_19b8;
  uint32_t local_19b4;
  AssertionResult local_19b0;
  AssertHelper local_19a0;
  Message local_1998;
  Amount local_1990;
  AssertHelper local_1980;
  Message local_1978;
  Amount local_1970;
  allocator local_1959;
  string local_1958;
  Address local_1938;
  allocator local_17b9;
  string local_17b8;
  Address local_1798;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1618;
  AssertHelper local_1600;
  Message local_15f8;
  AssertHelper local_15f0;
  Message local_15e8;
  AssertHelper local_15e0;
  Message local_15d8 [2];
  Transaction local_15c8 [3];
  allocator local_14f1;
  string local_14f0;
  Txid local_14d0 [2];
  Txid local_1488;
  undefined4 local_1468;
  undefined4 local_1248;
  allocator local_fb9;
  string local_fb8;
  Txid local_f98 [2];
  Txid local_f50;
  undefined4 local_f30;
  undefined4 local_d10;
  allocator local_a81;
  string local_a80;
  Txid local_a60 [2];
  Txid local_a18;
  undefined4 local_9f8;
  undefined4 local_7d8;
  allocator local_539;
  string local_538;
  Txid local_518 [2];
  Txid local_4d0;
  undefined4 local_4b0;
  undefined4 local_290;
  
  uVar8 = (undefined1)((ulong)in_stack_ffffffffffffd978 >> 0x38);
  cfd::UtxoData::UtxoData(in_stack_ffffffffffffd990);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_538,"9e1ead91c432889cb478237da974dd1e9009c9e22694fd1e3999c40a1ef59b0a"
             ,&local_539);
  cfd::core::Txid::Txid(local_518,&local_538);
  cfd::core::Txid::operator=(&local_4d0,local_518);
  cfd::core::Txid::~Txid((Txid *)0x242f3a);
  std::__cxx11::string::~string((string *)&local_538);
  std::allocator<char>::~allocator((allocator<char> *)&local_539);
  local_4b0 = 1;
  local_290 = 4;
  cfd::UtxoData::UtxoData(in_stack_ffffffffffffd990);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_a80,"8f4af7ee42e62a3d32f25ca56f618fb2f5df3d4c3a9c59e2c3646c5535a3d40a"
             ,&local_a81);
  cfd::core::Txid::Txid(local_a60,&local_a80);
  cfd::core::Txid::operator=(&local_a18,local_a60);
  cfd::core::Txid::~Txid((Txid *)0x242fe7);
  std::__cxx11::string::~string((string *)&local_a80);
  std::allocator<char>::~allocator((allocator<char> *)&local_a81);
  local_9f8 = 2;
  local_7d8 = 4;
  cfd::UtxoData::UtxoData(in_stack_ffffffffffffd990);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_fb8,"b9720ed2265a4ced42425bffdb4ef90a473b4106811a802fce53f7c57487fa0b"
             ,&local_fb9);
  cfd::core::Txid::Txid(local_f98,&local_fb8);
  cfd::core::Txid::operator=(&local_f50,local_f98);
  cfd::core::Txid::~Txid((Txid *)0x243094);
  std::__cxx11::string::~string((string *)&local_fb8);
  std::allocator<char>::~allocator((allocator<char> *)&local_fb9);
  local_f30 = 3;
  local_d10 = 4;
  cfd::UtxoData::UtxoData(in_stack_ffffffffffffd990);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_14f0,
             "0f093988839178ea5895431241cb4400fb31dd7b665a1a93cbd372336c717e0c",&local_14f1);
  cfd::core::Txid::Txid(local_14d0,&local_14f0);
  cfd::core::Txid::operator=(&local_1488,local_14d0);
  cfd::core::Txid::~Txid((Txid *)0x243141);
  std::__cxx11::string::~string((string *)&local_14f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_14f1);
  local_1468 = 4;
  local_1248 = 4;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector
            ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)0x243186);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::push_back
            ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)in_stack_ffffffffffffd940,
             (value_type *)CONCAT17(in_stack_ffffffffffffd93f,in_stack_ffffffffffffd938));
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::push_back
            ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)in_stack_ffffffffffffd940,
             (value_type *)CONCAT17(in_stack_ffffffffffffd93f,in_stack_ffffffffffffd938));
  cfd::TransactionContext::TransactionContext
            ((TransactionContext *)in_stack_ffffffffffffd930,
             CONCAT13(in_stack_ffffffffffffd92f,
                      CONCAT12(in_stack_ffffffffffffd92e,in_stack_ffffffffffffd92c)),
             in_stack_ffffffffffffd928);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::TransactionContext::AddInput
                (in_stack_ffffffffffffd940,
                 (UtxoData *)CONCAT17(in_stack_ffffffffffffd93f,in_stack_ffffffffffffd938));
    }
  }
  else {
    testing::Message::Message(local_15d8);
    testing::internal::AssertHelper::AssertHelper
              (&local_15e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x129,
               "Expected: ctx.AddInput(utxo1) doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=(&local_15e0,local_15d8);
    testing::internal::AssertHelper::~AssertHelper(&local_15e0);
    testing::Message::~Message((Message *)0x2434f4);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::TransactionContext::AddInput
                (in_stack_ffffffffffffdf70,in_stack_ffffffffffffdf68,in_stack_ffffffffffffdf64);
    }
  }
  else {
    testing::Message::Message(&local_15e8);
    testing::internal::AssertHelper::AssertHelper
              (&local_15f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x12a,
               "Expected: ctx.AddInput(utxo2, 0xf0ffffff) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_15f0,&local_15e8);
    testing::internal::AssertHelper::~AssertHelper(&local_15f0);
    testing::Message::~Message((Message *)0x243638);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::TransactionContext::AddInputs
                ((TransactionContext *)CONCAT17(in_stack_ffffffffffffd967,in_stack_ffffffffffffd960)
                 ,in_stack_ffffffffffffd958);
    }
  }
  else {
    testing::Message::Message(&local_15f8);
    testing::internal::AssertHelper::AssertHelper
              (&local_1600,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,299,
               "Expected: ctx.AddInputs(utxos) doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=(&local_1600,&local_15f8);
    testing::internal::AssertHelper::~AssertHelper(&local_1600);
    testing::Message::~Message((Message *)0x243777);
  }
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x2437d7);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (in_stack_ffffffffffffd950,CONCAT17(in_stack_ffffffffffffd94f,in_stack_ffffffffffffd948)
             ,(allocator_type *)in_stack_ffffffffffffd940);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x243800);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_17b8,"3K4cCA6U45jhvBcgc8qEdjHGDGyUMuVRpG",&local_17b9);
  cfd::core::Address::Address(&local_1798,&local_17b8);
  std::__cxx11::string::~string((string *)&local_17b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_17b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1958,"bc1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5uax7v9q",&local_1959);
  cfd::core::Address::Address(&local_1938,&local_1958);
  std::__cxx11::string::~string((string *)&local_1958);
  std::allocator<char>::~allocator((allocator<char> *)&local_1959);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Amount::Amount(&local_1970,0.1);
      uVar2 = cfd::TransactionContext::AddTxOut
                        (in_stack_ffffffffffffd9b0,in_stack_ffffffffffffd9a8,
                         (Amount *)CONCAT17(in_stack_ffffffffffffd9a7,in_stack_ffffffffffffd9a0));
      pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_1618,0);
      *pvVar3 = uVar2;
    }
  }
  else {
    testing::Message::Message(&local_1978);
    testing::internal::AssertHelper::AssertHelper
              (&local_1980,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x12f,
               "Expected: indexes[0] = ctx.AddTxOut(address1, Amount(0.1)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_1980,&local_1978);
    testing::internal::AssertHelper::~AssertHelper(&local_1980);
    testing::Message::~Message((Message *)0x243ad6);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Amount::Amount(&local_1990,0.01);
      uVar2 = cfd::TransactionContext::AddTxOut
                        (in_stack_ffffffffffffd9b0,in_stack_ffffffffffffd9a8,
                         (Amount *)CONCAT17(in_stack_ffffffffffffd9a7,in_stack_ffffffffffffd9a0));
      pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_1618,1);
      *pvVar3 = uVar2;
    }
  }
  else {
    testing::Message::Message(&local_1998);
    testing::internal::AssertHelper::AssertHelper
              (&local_19a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x130,
               "Expected: indexes[1] = ctx.AddTxOut(address2, Amount(0.01)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_19a0,&local_1998);
    testing::internal::AssertHelper::~AssertHelper(&local_19a0);
    testing::Message::~Message((Message *)0x243c5c);
  }
  local_19b4 = cfd::core::Transaction::GetTxInCount(local_15c8);
  local_19b8 = 4;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((char *)CONCAT17(in_stack_ffffffffffffd94f,in_stack_ffffffffffffd948),
             (char *)in_stack_ffffffffffffd940,
             (uint *)CONCAT17(in_stack_ffffffffffffd93f,in_stack_ffffffffffffd938),
             (int *)in_stack_ffffffffffffd930);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_19b0);
  if (!bVar1) {
    testing::Message::Message(&local_19c0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x243d60);
    testing::internal::AssertHelper::AssertHelper
              (&local_19c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x132,pcVar4);
    testing::internal::AssertHelper::operator=(&local_19c8,&local_19c0);
    testing::internal::AssertHelper::~AssertHelper(&local_19c8);
    testing::Message::~Message((Message *)0x243dc3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x243e1b);
  local_19dc = cfd::core::Transaction::GetTxOutCount(local_15c8);
  local_19e0 = 2;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((char *)CONCAT17(in_stack_ffffffffffffd94f,in_stack_ffffffffffffd948),
             (char *)in_stack_ffffffffffffd940,
             (uint *)CONCAT17(in_stack_ffffffffffffd93f,in_stack_ffffffffffffd938),
             (int *)in_stack_ffffffffffffd930);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_19d8);
  if (!bVar1) {
    testing::Message::Message(&local_19e8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x243ee6);
    testing::internal::AssertHelper::AssertHelper
              (&local_19f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x133,pcVar4);
    testing::internal::AssertHelper::operator=(&local_19f0,&local_19e8);
    testing::internal::AssertHelper::~AssertHelper(&local_19f0);
    testing::Message::~Message((Message *)0x243f49);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x243fa1);
  local_1a04 = cfd::TransactionContext::GetSizeIgnoreTxIn(in_stack_ffffffffffffd980,(bool)uVar8);
  local_1a08 = 0x4b;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((char *)CONCAT17(in_stack_ffffffffffffd94f,in_stack_ffffffffffffd948),
             (char *)in_stack_ffffffffffffd940,
             (uint *)CONCAT17(in_stack_ffffffffffffd93f,in_stack_ffffffffffffd938),
             (int *)in_stack_ffffffffffffd930);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1a00);
  if (!bVar1) {
    testing::Message::Message(&local_1a10);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x244071);
    testing::internal::AssertHelper::AssertHelper
              (&local_1a18,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x134,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1a18,&local_1a10);
    testing::internal::AssertHelper::~AssertHelper(&local_1a18);
    testing::Message::~Message((Message *)0x2440d4);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x24412c);
  local_1a2c = cfd::TransactionContext::GetVsizeIgnoreTxIn
                         ((TransactionContext *)in_stack_ffffffffffffd930,
                          (bool)in_stack_ffffffffffffd92f);
  local_1a30 = 0x4b;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((char *)CONCAT17(in_stack_ffffffffffffd94f,in_stack_ffffffffffffd948),
             (char *)in_stack_ffffffffffffd940,
             (uint *)CONCAT17(in_stack_ffffffffffffd93f,in_stack_ffffffffffffd938),
             (int *)in_stack_ffffffffffffd930);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1a28);
  if (!bVar1) {
    testing::Message::Message(&local_1a38);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x2441fc);
    testing::internal::AssertHelper::AssertHelper
              (&local_1a40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x135,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1a40,&local_1a38);
    testing::internal::AssertHelper::~AssertHelper(&local_1a40);
    testing::Message::~Message((Message *)0x24425f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2442b7);
  uVar2 = cfd::core::Transaction::GetTxInCount(local_15c8);
  if (uVar2 == 4) {
    cfd::core::Transaction::GetTxInList(&local_1a58,local_15c8);
    std::vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>::operator[]
              (&local_1a58,0);
    cfd::core::AbstractTxInReference::GetTxid
              ((AbstractTxInReference *)
               CONCAT17(in_stack_ffffffffffffd92f,
                        CONCAT16(in_stack_ffffffffffffd92e,
                                 CONCAT24(in_stack_ffffffffffffd92c,in_stack_ffffffffffffd928))));
    cfd::core::Txid::GetHex_abi_cxx11_(&local_1a88,&local_1aa8);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    cfd::core::Txid::GetHex_abi_cxx11_(&local_1ac8,&local_4d0);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)&local_1a68,"ref_list[0].GetTxid().GetHex().c_str()",
               "utxo1.txid.GetHex().c_str()",pcVar4,pcVar5);
    std::__cxx11::string::~string((string *)&local_1ac8);
    std::__cxx11::string::~string((string *)&local_1a88);
    cfd::core::Txid::~Txid((Txid *)0x2443b6);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1a68);
    if (!bVar1) {
      testing::Message::Message(&local_1ad0);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x2444ad);
      testing::internal::AssertHelper::AssertHelper
                (&local_1ad8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
                 ,0x138,pcVar4);
      testing::internal::AssertHelper::operator=(&local_1ad8,&local_1ad0);
      testing::internal::AssertHelper::~AssertHelper(&local_1ad8);
      testing::Message::~Message((Message *)0x244510);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x244568);
    std::vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>::operator[]
              (&local_1a58,1);
    cfd::core::AbstractTxInReference::GetTxid
              ((AbstractTxInReference *)
               CONCAT17(in_stack_ffffffffffffd92f,
                        CONCAT16(in_stack_ffffffffffffd92e,
                                 CONCAT24(in_stack_ffffffffffffd92c,in_stack_ffffffffffffd928))));
    cfd::core::Txid::GetHex_abi_cxx11_(&local_1b08,&local_1b28);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    cfd::core::Txid::GetHex_abi_cxx11_(&local_1b48,&local_a18);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)&local_1ae8,"ref_list[1].GetTxid().GetHex().c_str()",
               "utxo2.txid.GetHex().c_str()",pcVar4,pcVar5);
    std::__cxx11::string::~string((string *)&local_1b48);
    std::__cxx11::string::~string((string *)&local_1b08);
    cfd::core::Txid::~Txid((Txid *)0x24462b);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1ae8);
    if (!bVar1) {
      testing::Message::Message(&local_1b50);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x244709);
      testing::internal::AssertHelper::AssertHelper
                (&local_1b58,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
                 ,0x139,pcVar4);
      testing::internal::AssertHelper::operator=(&local_1b58,&local_1b50);
      testing::internal::AssertHelper::~AssertHelper(&local_1b58);
      testing::Message::~Message((Message *)0x24476c);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x2447c4);
    std::vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>::operator[]
              (&local_1a58,2);
    cfd::core::AbstractTxInReference::GetTxid
              ((AbstractTxInReference *)
               CONCAT17(in_stack_ffffffffffffd92f,
                        CONCAT16(in_stack_ffffffffffffd92e,
                                 CONCAT24(in_stack_ffffffffffffd92c,in_stack_ffffffffffffd928))));
    cfd::core::Txid::GetHex_abi_cxx11_(&local_1b88,&local_1ba8);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    cfd::core::Txid::GetHex_abi_cxx11_(&local_1bc8,&local_f50);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)&local_1b68,"ref_list[2].GetTxid().GetHex().c_str()",
               "utxo3.txid.GetHex().c_str()",pcVar4,pcVar5);
    std::__cxx11::string::~string((string *)&local_1bc8);
    std::__cxx11::string::~string((string *)&local_1b88);
    cfd::core::Txid::~Txid((Txid *)0x244887);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1b68);
    if (!bVar1) {
      testing::Message::Message(&local_1bd0);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x244965);
      testing::internal::AssertHelper::AssertHelper
                (&local_1bd8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
                 ,0x13a,pcVar4);
      testing::internal::AssertHelper::operator=(&local_1bd8,&local_1bd0);
      testing::internal::AssertHelper::~AssertHelper(&local_1bd8);
      testing::Message::~Message((Message *)0x2449c8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x244a20);
    std::vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>::operator[]
              (&local_1a58,3);
    cfd::core::AbstractTxInReference::GetTxid
              ((AbstractTxInReference *)
               CONCAT17(in_stack_ffffffffffffd92f,
                        CONCAT16(in_stack_ffffffffffffd92e,
                                 CONCAT24(in_stack_ffffffffffffd92c,in_stack_ffffffffffffd928))));
    cfd::core::Txid::GetHex_abi_cxx11_(&local_1c08,&local_1c28);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    cfd::core::Txid::GetHex_abi_cxx11_(&local_1c48,&local_1488);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)&local_1be8,"ref_list[3].GetTxid().GetHex().c_str()",
               "utxo4.txid.GetHex().c_str()",pcVar4,pcVar5);
    std::__cxx11::string::~string((string *)&local_1c48);
    std::__cxx11::string::~string((string *)&local_1c08);
    cfd::core::Txid::~Txid((Txid *)0x244ae3);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1be8);
    if (!bVar1) {
      testing::Message::Message(&local_1c50);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x244bc1);
      testing::internal::AssertHelper::AssertHelper
                (&local_1c58,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
                 ,0x13b,pcVar4);
      testing::internal::AssertHelper::operator=(&local_1c58,&local_1c50);
      testing::internal::AssertHelper::~AssertHelper(&local_1c58);
      testing::Message::~Message((Message *)0x244c24);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x244c7c);
    pAVar6 = &std::vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>::
              operator[](&local_1a58,0)->super_AbstractTxInReference;
    local_1c6c = cfd::core::AbstractTxInReference::GetVout(pAVar6);
    local_1c70 = 1;
    testing::internal::EqHelper<false>::Compare<unsigned_int,int>
              ((char *)CONCAT17(in_stack_ffffffffffffd94f,in_stack_ffffffffffffd948),
               (char *)in_stack_ffffffffffffd940,
               (uint *)CONCAT17(in_stack_ffffffffffffd93f,in_stack_ffffffffffffd938),
               (int *)in_stack_ffffffffffffd930);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1c68);
    if (!bVar1) {
      testing::Message::Message(&local_1c78);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x244d53);
      testing::internal::AssertHelper::AssertHelper
                (&local_1c80,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
                 ,0x13c,pcVar4);
      testing::internal::AssertHelper::operator=(&local_1c80,&local_1c78);
      testing::internal::AssertHelper::~AssertHelper(&local_1c80);
      testing::Message::~Message((Message *)0x244db6);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x244e0e);
    pAVar6 = &std::vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>::
              operator[](&local_1a58,1)->super_AbstractTxInReference;
    local_1c94 = cfd::core::AbstractTxInReference::GetVout(pAVar6);
    local_1c98 = 2;
    testing::internal::EqHelper<false>::Compare<unsigned_int,int>
              ((char *)CONCAT17(in_stack_ffffffffffffd94f,in_stack_ffffffffffffd948),
               (char *)in_stack_ffffffffffffd940,
               (uint *)CONCAT17(in_stack_ffffffffffffd93f,in_stack_ffffffffffffd938),
               (int *)in_stack_ffffffffffffd930);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1c90);
    if (!bVar1) {
      testing::Message::Message(&local_1ca0);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x244ee6);
      testing::internal::AssertHelper::AssertHelper
                (&local_1ca8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
                 ,0x13d,pcVar4);
      testing::internal::AssertHelper::operator=(&local_1ca8,&local_1ca0);
      testing::internal::AssertHelper::~AssertHelper(&local_1ca8);
      testing::Message::~Message((Message *)0x244f49);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x244fa1);
    pAVar6 = &std::vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>::
              operator[](&local_1a58,2)->super_AbstractTxInReference;
    local_1cbc = cfd::core::AbstractTxInReference::GetVout(pAVar6);
    local_1cc0 = 3;
    testing::internal::EqHelper<false>::Compare<unsigned_int,int>
              ((char *)CONCAT17(in_stack_ffffffffffffd94f,in_stack_ffffffffffffd948),
               (char *)in_stack_ffffffffffffd940,
               (uint *)CONCAT17(in_stack_ffffffffffffd93f,in_stack_ffffffffffffd938),
               (int *)in_stack_ffffffffffffd930);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1cb8);
    if (!bVar1) {
      testing::Message::Message(&local_1cc8);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x245079);
      testing::internal::AssertHelper::AssertHelper
                (&local_1cd0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
                 ,0x13e,pcVar4);
      testing::internal::AssertHelper::operator=(&local_1cd0,&local_1cc8);
      testing::internal::AssertHelper::~AssertHelper(&local_1cd0);
      testing::Message::~Message((Message *)0x2450dc);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x245134);
    pAVar6 = &std::vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>::
              operator[](&local_1a58,3)->super_AbstractTxInReference;
    local_1ce4 = cfd::core::AbstractTxInReference::GetVout(pAVar6);
    local_1ce8 = 4;
    testing::internal::EqHelper<false>::Compare<unsigned_int,int>
              ((char *)CONCAT17(in_stack_ffffffffffffd94f,in_stack_ffffffffffffd948),
               (char *)in_stack_ffffffffffffd940,
               (uint *)CONCAT17(in_stack_ffffffffffffd93f,in_stack_ffffffffffffd938),
               (int *)in_stack_ffffffffffffd930);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1ce0);
    if (!bVar1) {
      testing::Message::Message(&local_1cf0);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x24520c);
      testing::internal::AssertHelper::AssertHelper
                (&local_1cf8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
                 ,0x13f,pcVar4);
      testing::internal::AssertHelper::operator=(&local_1cf8,&local_1cf0);
      testing::internal::AssertHelper::~AssertHelper(&local_1cf8);
      testing::Message::~Message((Message *)0x24526f);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x2452c7);
    pAVar6 = &std::vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>::
              operator[](&local_1a58,1)->super_AbstractTxInReference;
    local_1d0c = cfd::core::AbstractTxInReference::GetSequence(pAVar6);
    local_1d10 = 0xf0ffffff;
    testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
              ((char *)CONCAT17(in_stack_ffffffffffffd94f,in_stack_ffffffffffffd948),
               (char *)in_stack_ffffffffffffd940,
               (uint *)CONCAT17(in_stack_ffffffffffffd93f,in_stack_ffffffffffffd938),
               (uint *)in_stack_ffffffffffffd930);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1d08);
    if (!bVar1) {
      testing::Message::Message(&local_1d18);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x24539f);
      testing::internal::AssertHelper::AssertHelper
                (&local_1d20,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
                 ,0x140,pcVar4);
      testing::internal::AssertHelper::operator=(&local_1d20,&local_1d18);
      testing::internal::AssertHelper::~AssertHelper(&local_1d20);
      testing::Message::~Message((Message *)0x245402);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x245457);
    std::vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>::~vector
              ((vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_> *)
               in_stack_ffffffffffffd940);
  }
  uVar2 = cfd::core::Transaction::GetTxOutCount(local_15c8);
  if (uVar2 == 2) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_1618,0);
    local_1d34 = 0;
    testing::internal::EqHelper<false>::Compare<unsigned_int,int>
              ((char *)CONCAT17(in_stack_ffffffffffffd94f,in_stack_ffffffffffffd948),
               (char *)in_stack_ffffffffffffd940,
               (uint *)CONCAT17(in_stack_ffffffffffffd93f,in_stack_ffffffffffffd938),
               (int *)in_stack_ffffffffffffd930);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1d30);
    if (!bVar1) {
      testing::Message::Message(&local_1d40);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x24554c);
      testing::internal::AssertHelper::AssertHelper
                (&local_1d48,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
                 ,0x143,pcVar4);
      testing::internal::AssertHelper::operator=(&local_1d48,&local_1d40);
      testing::internal::AssertHelper::~AssertHelper(&local_1d48);
      testing::Message::~Message((Message *)0x2455af);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x245604);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_1618,1);
    local_1d5c = 1;
    testing::internal::EqHelper<false>::Compare<unsigned_int,int>
              ((char *)CONCAT17(in_stack_ffffffffffffd94f,in_stack_ffffffffffffd948),
               (char *)in_stack_ffffffffffffd940,
               (uint *)CONCAT17(in_stack_ffffffffffffd93f,in_stack_ffffffffffffd938),
               (int *)in_stack_ffffffffffffd930);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1d58);
    if (!bVar1) {
      testing::Message::Message(&local_1d68);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x2456b8);
      testing::internal::AssertHelper::AssertHelper
                (&local_1d70,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
                 ,0x144,pcVar4);
      testing::internal::AssertHelper::operator=(&local_1d70,&local_1d68);
      testing::internal::AssertHelper::~AssertHelper(&local_1d70);
      testing::Message::~Message((Message *)0x24571b);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x245773);
    cfd::core::Transaction::GetTxOutList(&local_1d88,local_15c8);
    std::vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>::operator[]
              (&local_1d88,0);
    cfd::core::AbstractTxOutReference::GetLockingScript
              ((AbstractTxOutReference *)
               CONCAT17(in_stack_ffffffffffffd92f,
                        CONCAT16(in_stack_ffffffffffffd92e,
                                 CONCAT24(in_stack_ffffffffffffd92c,in_stack_ffffffffffffd928))));
    cfd::core::Script::GetHex_abi_cxx11_(&local_1db8,&local_1df0);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    cfd::core::Address::GetLockingScript(&local_1e48,&local_1798);
    cfd::core::Script::GetHex_abi_cxx11_(&local_1e10,&local_1e48);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)&local_1d98,"ref_list[0].GetLockingScript().GetHex().c_str()",
               "address1.GetLockingScript().GetHex().c_str()",pcVar4,pcVar5);
    std::__cxx11::string::~string((string *)&local_1e10);
    cfd::core::Script::~Script((Script *)in_stack_ffffffffffffd930);
    std::__cxx11::string::~string((string *)&local_1db8);
    cfd::core::Script::~Script((Script *)in_stack_ffffffffffffd930);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1d98);
    if (!bVar1) {
      testing::Message::Message(&local_1e50);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x245984);
      testing::internal::AssertHelper::AssertHelper
                (&local_1e58,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
                 ,0x147,pcVar4);
      testing::internal::AssertHelper::operator=(&local_1e58,&local_1e50);
      testing::internal::AssertHelper::~AssertHelper(&local_1e58);
      testing::Message::~Message((Message *)0x2459e1);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x245a39);
    std::vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>::operator[]
              (&local_1d88,1);
    cfd::core::AbstractTxOutReference::GetLockingScript
              ((AbstractTxOutReference *)
               CONCAT17(in_stack_ffffffffffffd92f,
                        CONCAT16(in_stack_ffffffffffffd92e,
                                 CONCAT24(in_stack_ffffffffffffd92c,in_stack_ffffffffffffd928))));
    cfd::core::Script::GetHex_abi_cxx11_(&local_1e88,&local_1ec0);
    in_stack_ffffffffffffd990 = (UtxoData *)std::__cxx11::string::c_str();
    cfd::core::Address::GetLockingScript(&local_1f18,&local_1938);
    cfd::core::Script::GetHex_abi_cxx11_(&local_1ee0,&local_1f18);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)&local_1e68,"ref_list[1].GetLockingScript().GetHex().c_str()",
               "address2.GetLockingScript().GetHex().c_str()",(char *)in_stack_ffffffffffffd990,
               pcVar4);
    std::__cxx11::string::~string((string *)&local_1ee0);
    cfd::core::Script::~Script((Script *)in_stack_ffffffffffffd930);
    std::__cxx11::string::~string((string *)&local_1e88);
    cfd::core::Script::~Script((Script *)in_stack_ffffffffffffd930);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1e68);
    if (!bVar1) {
      testing::Message::Message(&local_1f20);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x245c15);
      testing::internal::AssertHelper::AssertHelper
                (&local_1f28,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
                 ,0x149,pcVar4);
      testing::internal::AssertHelper::operator=(&local_1f28,&local_1f20);
      testing::internal::AssertHelper::~AssertHelper(&local_1f28);
      testing::Message::~Message((Message *)0x245c72);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x245cca);
    pAVar7 = &std::vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>::
              operator[](&local_1d88,0)->super_AbstractTxOutReference;
    AVar9 = cfd::core::AbstractTxOutReference::GetValue(pAVar7);
    local_1f60 = AVar9.amount_;
    local_1f58 = AVar9.ignore_check_;
    local_1f50.amount_ = local_1f60;
    local_1f50.ignore_check_ = (bool)local_1f58;
    local_1f40 = cfd::core::Amount::GetCoinValue(&local_1f50);
    local_1f68 = 0x3fb999999999999a;
    testing::internal::EqHelper<false>::Compare<double,double>
              ((char *)CONCAT17(in_stack_ffffffffffffd94f,in_stack_ffffffffffffd948),
               (char *)in_stack_ffffffffffffd940,
               (double *)CONCAT17(in_stack_ffffffffffffd93f,in_stack_ffffffffffffd938),
               (double *)in_stack_ffffffffffffd930);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1f38);
    if (!bVar1) {
      testing::Message::Message(&local_1f70);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x245df0);
      testing::internal::AssertHelper::AssertHelper
                (&local_1f78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
                 ,0x14a,pcVar4);
      testing::internal::AssertHelper::operator=(&local_1f78,&local_1f70);
      testing::internal::AssertHelper::~AssertHelper(&local_1f78);
      testing::Message::~Message((Message *)0x245e4d);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x245ea5);
    pAVar7 = &std::vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>::
              operator[](&local_1d88,1)->super_AbstractTxOutReference;
    AVar9 = cfd::core::AbstractTxOutReference::GetValue(pAVar7);
    local_1fb0 = AVar9.amount_;
    uVar8 = AVar9.ignore_check_;
    local_1fa8 = uVar8;
    local_1fa0.amount_ = local_1fb0;
    local_1fa0.ignore_check_ = (bool)uVar8;
    in_stack_ffffffffffffd940 = (TransactionContext *)cfd::core::Amount::GetCoinValue(&local_1fa0);
    local_1fb8 = 0x3f847ae147ae147b;
    local_1f90 = in_stack_ffffffffffffd940;
    testing::internal::EqHelper<false>::Compare<double,double>
              ((char *)CONCAT17(uVar8,in_stack_ffffffffffffd948),(char *)in_stack_ffffffffffffd940,
               (double *)CONCAT17(in_stack_ffffffffffffd93f,in_stack_ffffffffffffd938),
               (double *)in_stack_ffffffffffffd930);
    in_stack_ffffffffffffd93f = testing::AssertionResult::operator_cast_to_bool(&local_1f88);
    if (!(bool)in_stack_ffffffffffffd93f) {
      testing::Message::Message(&local_1fc0);
      in_stack_ffffffffffffd930 =
           (UtxoData *)testing::AssertionResult::failure_message((AssertionResult *)0x245fcc);
      testing::internal::AssertHelper::AssertHelper
                (&local_1fc8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
                 ,0x14b,(char *)in_stack_ffffffffffffd930);
      testing::internal::AssertHelper::operator=(&local_1fc8,&local_1fc0);
      testing::internal::AssertHelper::~AssertHelper(&local_1fc8);
      testing::Message::~Message((Message *)0x246029);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x24607e);
    std::vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>::~vector
              ((vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_> *)
               in_stack_ffffffffffffd940);
  }
  cfd::UtxoData::UtxoData(in_stack_ffffffffffffd990);
  testing::internal::ConstCharPtr::ConstCharPtr(local_24c0,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool(local_24c0);
  if (bVar1) {
    local_24c1 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::TransactionContext::AddInput
                (in_stack_ffffffffffffd940,
                 (UtxoData *)CONCAT17(in_stack_ffffffffffffd93f,in_stack_ffffffffffffd938));
    }
    if ((local_24c1 & 1) != 0) goto LAB_00246297;
    local_24c0[0].value =
         "Expected: ctx.AddInput(utxo_stub) throws an exception of type CfdException.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_24d8);
  testing::internal::AssertHelper::AssertHelper
            (&local_24e0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
             ,0x14f,local_24c0[0].value);
  testing::internal::AssertHelper::operator=(&local_24e0,local_24d8);
  testing::internal::AssertHelper::~AssertHelper(&local_24e0);
  testing::Message::~Message((Message *)0x24624c);
LAB_00246297:
  cfd::UtxoData::~UtxoData(in_stack_ffffffffffffd930);
  cfd::core::Address::~Address((Address *)in_stack_ffffffffffffd930);
  cfd::core::Address::~Address((Address *)in_stack_ffffffffffffd930);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffd940);
  cfd::TransactionContext::~TransactionContext((TransactionContext *)in_stack_ffffffffffffd930);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector
            ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)in_stack_ffffffffffffd940);
  cfd::UtxoData::~UtxoData(in_stack_ffffffffffffd930);
  cfd::UtxoData::~UtxoData(in_stack_ffffffffffffd930);
  cfd::UtxoData::~UtxoData(in_stack_ffffffffffffd930);
  cfd::UtxoData::~UtxoData(in_stack_ffffffffffffd930);
  return;
}

Assistant:

TEST(TransactionContext, Input_Output) {
  // input-output test
  UtxoData utxo1;
  utxo1.txid = Txid("9e1ead91c432889cb478237da974dd1e9009c9e22694fd1e3999c40a1ef59b0a");
  utxo1.vout = 1;
  utxo1.address_type = AddressType::kP2wpkhAddress;
  UtxoData utxo2;
  utxo2.txid = Txid("8f4af7ee42e62a3d32f25ca56f618fb2f5df3d4c3a9c59e2c3646c5535a3d40a");
  utxo2.vout = 2;
  utxo2.address_type = AddressType::kP2wpkhAddress;
  UtxoData utxo3;
  utxo3.txid = Txid("b9720ed2265a4ced42425bffdb4ef90a473b4106811a802fce53f7c57487fa0b");
  utxo3.vout = 3;
  utxo3.address_type = AddressType::kP2wpkhAddress;
  UtxoData utxo4;
  utxo4.txid = Txid("0f093988839178ea5895431241cb4400fb31dd7b665a1a93cbd372336c717e0c");
  utxo4.vout = 4;
  utxo4.address_type = AddressType::kP2wpkhAddress;
  std::vector<UtxoData> utxos;
  utxos.push_back(utxo3);
  utxos.push_back(utxo4);

  TransactionContext ctx(2, 0);

  EXPECT_NO_THROW(ctx.AddInput(utxo1));
  EXPECT_NO_THROW(ctx.AddInput(utxo2, 0xf0ffffff));
  EXPECT_NO_THROW(ctx.AddInputs(utxos));
  std::vector<uint32_t> indexes(2);
  Address address1("3K4cCA6U45jhvBcgc8qEdjHGDGyUMuVRpG");
  Address address2("bc1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5uax7v9q");
  EXPECT_NO_THROW(indexes[0] = ctx.AddTxOut(address1, Amount(0.1)));
  EXPECT_NO_THROW(indexes[1] = ctx.AddTxOut(address2, Amount(0.01)));

  EXPECT_EQ(ctx.GetTxInCount(), 4);
  EXPECT_EQ(ctx.GetTxOutCount(), 2);
  EXPECT_EQ(ctx.GetSizeIgnoreTxIn(), 75);
  EXPECT_EQ(ctx.GetVsizeIgnoreTxIn(), 75);
  if (ctx.GetTxInCount() == 4) {
    auto ref_list = ctx.GetTxInList();
    EXPECT_STREQ(ref_list[0].GetTxid().GetHex().c_str(), utxo1.txid.GetHex().c_str());
    EXPECT_STREQ(ref_list[1].GetTxid().GetHex().c_str(), utxo2.txid.GetHex().c_str());
    EXPECT_STREQ(ref_list[2].GetTxid().GetHex().c_str(), utxo3.txid.GetHex().c_str());
    EXPECT_STREQ(ref_list[3].GetTxid().GetHex().c_str(), utxo4.txid.GetHex().c_str());
    EXPECT_EQ(ref_list[0].GetVout(), 1);
    EXPECT_EQ(ref_list[1].GetVout(), 2);
    EXPECT_EQ(ref_list[2].GetVout(), 3);
    EXPECT_EQ(ref_list[3].GetVout(), 4);
    EXPECT_EQ(ref_list[1].GetSequence(), 0xf0ffffff);
  }
  if (ctx.GetTxOutCount() == 2) {
    EXPECT_EQ(indexes[0], 0);
    EXPECT_EQ(indexes[1], 1);
    auto ref_list = ctx.GetTxOutList();
    EXPECT_STREQ(ref_list[0].GetLockingScript().GetHex().c_str(),
                 address1.GetLockingScript().GetHex().c_str());
    EXPECT_STREQ(ref_list[1].GetLockingScript().GetHex().c_str(),
                 address2.GetLockingScript().GetHex().c_str());
    EXPECT_EQ(ref_list[0].GetValue().GetCoinValue(), 0.1);
    EXPECT_EQ(ref_list[1].GetValue().GetCoinValue(), 0.01);
  }

  UtxoData utxo_stub;
  EXPECT_THROW(ctx.AddInput(utxo_stub), CfdException);
}